

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  int iVar1;
  uint uVar2;
  ImGuiTable *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindowStackData *pIVar5;
  ImGuiTabBar *pIVar6;
  ImGuiContext *pIVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  
  pIVar7 = GImGui;
  pIVar3 = GImGui->CurrentTable;
  while (pIVar3 != (ImGuiTable *)0x0) {
    if ((pIVar3->OuterWindow != pIVar7->CurrentWindow) &&
       (pIVar3->InnerWindow != pIVar7->CurrentWindow)) break;
    if (log_callback != (ImGuiErrorLogCallback)0x0) {
      (*log_callback)(user_data,"Recovered from missing EndTable() in \'%s\'",
                      pIVar3->OuterWindow->Name);
    }
    EndTable();
    pIVar3 = pIVar7->CurrentTable;
  }
  lVar8 = (long)(pIVar7->CurrentWindowStack).Size;
  if (0 < lVar8) {
    pIVar4 = pIVar7->CurrentWindow;
    if (pIVar4 == (ImGuiWindow *)0x0) {
      __assert_fail("window != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x2226,"void ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback, void *)")
      ;
    }
    pIVar5 = (pIVar7->CurrentWindowStack).Data;
    pIVar6 = pIVar7->CurrentTabBar;
    while (pIVar6 != (ImGuiTabBar *)0x0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar4->Name);
      }
      EndTabBar();
      pIVar6 = pIVar7->CurrentTabBar;
    }
    iVar1 = (pIVar4->DC).TreeDepth;
    while (0 < iVar1) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar4->Name);
      }
      TreePop();
      iVar1 = (pIVar4->DC).TreeDepth;
    }
    if ((int)pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfGroupStack < (pIVar7->GroupStack).Size) {
      do {
        if (log_callback != (ImGuiErrorLogCallback)0x0) {
          (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar4->Name);
        }
        EndGroup();
      } while ((int)pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfGroupStack <
               (pIVar7->GroupStack).Size);
    }
    iVar1 = (pIVar4->IDStack).Size;
    while (1 < iVar1) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar4->Name);
      }
      PopID();
      iVar1 = (pIVar4->IDStack).Size;
    }
    if (pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfDisabledStack < pIVar7->DisabledStackSize) {
      do {
        if (log_callback != (ImGuiErrorLogCallback)0x0) {
          (*log_callback)(user_data,"Recovered from missing EndDisabled() in \'%s\'",pIVar4->Name);
        }
        EndDisabled();
      } while (pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfDisabledStack < pIVar7->DisabledStackSize)
      ;
    }
    do {
      uVar2 = (pIVar7->ColorStack).Size;
      if ((int)uVar2 <= (int)pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfColorStack) {
        if ((int)pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfItemFlagsStack <
            (pIVar7->ItemFlagsStack).Size) {
          do {
            if (log_callback != (ImGuiErrorLogCallback)0x0) {
              (*log_callback)(user_data,"Recovered from missing PopItemFlag() in \'%s\'",
                              pIVar4->Name);
            }
            PopItemFlag();
          } while ((int)pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfItemFlagsStack <
                   (pIVar7->ItemFlagsStack).Size);
        }
        if ((int)pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfStyleVarStack <
            (pIVar7->StyleVarStack).Size) {
          do {
            if (log_callback != (ImGuiErrorLogCallback)0x0) {
              (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",
                              pIVar4->Name);
            }
            PopStyleVar(1);
          } while ((int)pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfStyleVarStack <
                   (pIVar7->StyleVarStack).Size);
        }
        if ((int)pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfFocusScopeStack <
            (pIVar7->FocusScopeStack).Size) {
          do {
            if (log_callback != (ImGuiErrorLogCallback)0x0) {
              (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",
                              pIVar4->Name);
            }
            PopFocusScope();
          } while ((int)pIVar5[lVar8 + -1].StackSizesOnBegin.SizeOfFocusScopeStack <
                   (pIVar7->FocusScopeStack).Size);
        }
        return;
      }
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        if ((int)uVar2 < 1) {
          pcVar10 = "T &ImVector<ImGuiColorMod>::back() [T = ImGuiColorMod]";
          goto LAB_00166218;
        }
        pcVar10 = pIVar4->Name;
        pcVar9 = GetStyleColorName((pIVar7->ColorStack).Data[(ulong)uVar2 - 1].Col);
        (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s"
                        ,pcVar10,pcVar9);
      }
      PopStyleColor(1);
    } while( true );
  }
  pcVar10 = "T &ImVector<ImGuiWindowStackData>::back() [T = ImGuiWindowStackData]";
LAB_00166218:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                ,0x758,pcVar10);
}

Assistant:

void    ImGui::ErrorCheckEndWindowRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    ImGuiContext& g = *GImGui;
    while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
        EndTable();
    }

    ImGuiWindow* window = g.CurrentWindow;
    ImGuiStackSizes* stack_sizes = &g.CurrentWindowStack.back().StackSizesOnBegin;
    IM_ASSERT(window != NULL);
    while (g.CurrentTabBar != NULL) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
        EndTabBar();
    }
    while (window->DC.TreeDepth > 0)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
        TreePop();
    }
    while (g.GroupStack.Size > stack_sizes->SizeOfGroupStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
        EndGroup();
    }
    while (window->IDStack.Size > 1)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
        PopID();
    }
    while (g.DisabledStackSize > stack_sizes->SizeOfDisabledStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing EndDisabled() in '%s'", window->Name);
        EndDisabled();
    }
    while (g.ColorStack.Size > stack_sizes->SizeOfColorStack)
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
        PopStyleColor();
    }
    while (g.ItemFlagsStack.Size > stack_sizes->SizeOfItemFlagsStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopItemFlag() in '%s'", window->Name);
        PopItemFlag();
    }
    while (g.StyleVarStack.Size > stack_sizes->SizeOfStyleVarStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
        PopStyleVar();
    }
    while (g.FocusScopeStack.Size > stack_sizes->SizeOfFocusScopeStack) //-V1044
    {
        if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
        PopFocusScope();
    }
}